

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void __thiscall zsummer::log4z::CLogerManager::GetExampleConfig_abi_cxx11_(CLogerManager *this)

{
  ILog4zManager IVar1;
  _func_int **__dest;
  size_type __dnew;
  ILog4zManager local_20;
  
  (this->super_CThread)._vptr_CThread = (_func_int **)&this->super_ILog4zManager;
  local_20._vptr_ILog4zManager = (_func_int **)0x50;
  __dest = (_func_int **)std::__cxx11::string::_M_create((ulong *)this,(ulong)&local_20);
  IVar1._vptr_ILog4zManager = local_20._vptr_ILog4zManager;
  (this->super_CThread)._vptr_CThread = __dest;
  (this->super_ILog4zManager)._vptr_ILog4zManager = local_20._vptr_ILog4zManager;
  memcpy(__dest,
         "[FileConfig]\n#path=./log/\n#level=DEBUG\n#display=true\n#monthdir=false\n#limit=100\n",
         0x50);
  (this->super_CThread).m_hThreadID = (unsigned_long_long)IVar1._vptr_ILog4zManager;
  *(undefined1 *)((long)__dest + (long)IVar1._vptr_ILog4zManager) = 0;
  return;
}

Assistant:

std::string GetExampleConfig()
	{
		return ""
			"[FileConfig]\n"
			"#path=./log/\n"
			"#level=DEBUG\n"
			"#display=true\n"
			"#monthdir=false\n"
			"#limit=100\n";
	}